

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Reg2B1(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint8 B2)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  bool success;
  RegSlot local_1c;
  RegSlot RStack_18;
  uint8 B2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  success = (bool)B2;
  local_1c = R1;
  RStack_18 = R0;
  R1_local._2_2_ = op;
  _R0_local = this;
  CheckOpen(this);
  op_00 = R1_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,Reg2B1);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(R1_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x255,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RStack_18 = ConsumeReg(this,RStack_18);
  local_1c = ConsumeReg(this,local_1c);
  bVar2 = TryWriteReg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,R1_local._2_2_,RStack_18,local_1c,success);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,R1_local._2_2_,RStack_18,local_1c,success), !bVar2)) &&
     (bVar2 = TryWriteReg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,R1_local._2_2_,RStack_18,local_1c,success), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x25a,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg2B1(OpCode op, RegSlot R0, RegSlot R1, uint8 B2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2B1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2B1, op, R0, R1, B2);
    }